

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

GoniometricLight *
pbrt::GoniometricLight::Create
          (Transform *renderFromLight,MediumHandle *medium,ParameterDictionary *parameters,
          RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  undefined1 auVar1 [16];
  GoniometricLight *pGVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Tuple2<pbrt::Point2,_int> TVar9;
  Tuple2<pbrt::Point2,_int> p;
  bool bVar10;
  Float FVar11;
  float fVar12;
  undefined1 auVar13 [64];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  allocator<char> local_5bd;
  Float sc;
  ulong local_5b8;
  float local_5ac;
  ParameterDictionary *local_5a8;
  float local_5a0;
  float local_59c;
  RGBColorSpace *imageColorSpace;
  SpectrumHandle I;
  Allocator alloc_local;
  WrapMode2D local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  string texname;
  Float swapYZ [4] [4];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_4c8;
  ColorEncodingHandle local_4c0;
  ImageChannelDesc yDesc;
  ColorEncodingHandle local_488;
  ulong local_480;
  Transform finalRenderFromLight;
  Transform t;
  ImageMetadata local_248;
  Image image;
  undefined1 extraout_var [60];
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>((string *)&t,"I",(allocator<char> *)&image);
  local_480 = (ulong)&colorSpace->illuminant | 0x2000000000000;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)&I,(string *)parameters,(SpectrumHandle *)&t,
             (SpectrumType)&local_480,(Allocator)0x1);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::string<std::allocator<char>>((string *)&t,"scale",(allocator<char> *)&image)
  ;
  FVar11 = ParameterDictionary::GetOneFloat(parameters,(string *)&t,1.0);
  local_5b8 = CONCAT44(local_5b8._4_4_,FVar11);
  std::__cxx11::string::~string((string *)&t);
  sc = (Float)local_5b8;
  Image::Image(&image,alloc);
  imageColorSpace = (RGBColorSpace *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&finalRenderFromLight,"filename",(allocator<char> *)&yDesc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)swapYZ,"",(allocator<char> *)&local_548);
  ParameterDictionary::GetOneString
            ((string *)&t,parameters,(string *)&finalRenderFromLight,(string *)swapYZ);
  ResolveFilename(&texname,(string *)&t);
  std::__cxx11::string::~string((string *)&t);
  std::__cxx11::string::~string((string *)swapYZ);
  std::__cxx11::string::~string((string *)&finalRenderFromLight);
  if (texname._M_string_length != 0) {
    local_488.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    Image::Read((ImageAndMetadata *)&t,&texname,alloc,&local_488);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&finalRenderFromLight,"R",(allocator<char> *)&yDesc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(finalRenderFromLight.m.m + 2),"G",(allocator<char> *)&local_548);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&finalRenderFromLight.mInv,"B",&local_5bd);
    requestedChannels.n = 3;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&finalRenderFromLight;
    Image::GetChannelDesc((ImageChannelDesc *)swapYZ,(Image *)&t,requestedChannels);
    lVar5 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)finalRenderFromLight.m.m[0] + lVar5));
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x20);
    local_5a8 = parameters;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&finalRenderFromLight,"Y",(allocator<char> *)&local_548);
    requestedChannels_00.n = 1;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&finalRenderFromLight;
    Image::GetChannelDesc(&yDesc,(Image *)&t,requestedChannels_00);
    std::__cxx11::string::~string((string *)&finalRenderFromLight);
    imageColorSpace = ImageMetadata::GetColorSpace(&local_248);
    if (swapYZ[2]._8_8_ == 0) {
      if (yDesc.offset.nStored == 0) {
        ErrorExit<std::__cxx11::string&>
                  (loc,"%s: has neither \"R\", \"G\", and \"B\" or \"Y\" channels.",&texname);
      }
      Image::operator=(&image,(Image *)&t);
    }
    else {
      if (yDesc.offset.nStored != 0) {
        ErrorExit<std::__cxx11::string&>
                  ("%s: has both \"R\", \"G\", and \"B\" or \"Y\" channels.",&texname);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"Y",&local_5bd);
      channels.n = 1;
      channels.ptr = &local_548;
      Image::Image((Image *)&finalRenderFromLight,(PixelFormat)t.m.m[0][0],(Point2i)t.m.m[0]._4_8_,
                   channels,&local_4c0,alloc_local);
      Image::operator=(&image,(Image *)&finalRenderFromLight);
      Image::~Image((Image *)&finalRenderFromLight);
      std::__cxx11::string::~string((string *)&local_548);
      lVar5 = 0;
      TVar9 = image.resolution.super_Tuple2<pbrt::Point2,_int>;
      for (local_5b8 = 0; (long)local_5b8 < (long)TVar9 >> 0x20; local_5b8 = local_5b8 + 1) {
        for (lVar6 = 0; lVar6 < TVar9.x; lVar6 = lVar6 + 1) {
          WrapMode2D::WrapMode2D(&local_550,Clamp);
          Image::GetChannels((ImageChannelValues *)&finalRenderFromLight,(Image *)&t,
                             (Point2i)(lVar5 + lVar6),(ImageChannelDesc *)swapYZ,local_550);
          FVar11 = ImageChannelValues::Average((ImageChannelValues *)&finalRenderFromLight);
          Image::SetChannel(&image,(Point2i)(lVar5 + lVar6),0,FVar11);
          InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                    ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                     &finalRenderFromLight);
          TVar9 = image.resolution.super_Tuple2<pbrt::Point2,_int>;
        }
        lVar5 = lVar5 + 0x100000000;
      }
    }
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&yDesc.offset);
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)swapYZ);
    ImageAndMetadata::~ImageAndMetadata((ImageAndMetadata *)&t);
    parameters = local_5a8;
  }
  local_4c8 = I.
              super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
              .bits;
  FVar11 = SpectrumToPhotometric((SpectrumHandle *)&local_4c8);
  sc = sc / FVar11;
  local_5a0 = sc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t,"power",(allocator<char> *)&finalRenderFromLight);
  local_5ac = ParameterDictionary::GetOneFloat(parameters,(string *)&t,-1.0);
  std::__cxx11::string::~string((string *)&t);
  if (0.0 < local_5ac) {
    WrapMode2D::WrapMode2D((WrapMode2D *)&finalRenderFromLight,Repeat,Clamp);
    TVar9.x = 0;
    TVar9.y = 0;
    uVar3 = image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
    uVar4 = image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
    local_59c = (float)(int)uVar4;
    local_5b8 = local_5b8 & 0xffffffff00000000;
    for (uVar7 = 0; uVar7 != (~((int)uVar4 >> 0x1f) & uVar4); uVar7 = uVar7 + 1) {
      fVar12 = sinf((((float)(int)uVar7 + 0.5) * 3.1415927) / local_59c);
      local_5a8 = (ParameterDictionary *)CONCAT44(local_5a8._4_4_,fVar12);
      uVar8 = (ulong)(~((int)uVar3 >> 0x1f) & uVar3);
      p = TVar9;
      while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
        Image::GetChannels((ImageChannelValues *)&t,&image,(Point2i)p,
                           (WrapMode2D)finalRenderFromLight.m.m[0]._0_8_);
        auVar13._0_4_ = ImageChannelValues::Average((ImageChannelValues *)&t);
        auVar13._4_60_ = extraout_var;
        auVar1 = vfmadd231ss_fma(ZEXT416((uint)(Float)local_5b8),auVar13._0_16_,
                                 ZEXT416((uint)local_5a8));
        local_5b8 = CONCAT44(local_5b8._4_4_,auVar1._0_4_);
        InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&t);
        p = (Tuple2<pbrt::Point2,_int>)((long)p + 1);
      }
      TVar9 = (Tuple2<pbrt::Point2,_int>)((long)TVar9 + 0x100000000);
    }
    sc = (local_5ac / (((Float)local_5b8 * 19.73921) / (float)(int)(uVar4 * uVar3))) * local_5a0;
  }
  swapYZ[0][2] = 0.0;
  swapYZ[0][3] = 0.0;
  swapYZ[1][0] = 0.0;
  swapYZ[1][1] = 0.0;
  swapYZ[2][2] = 0.0;
  swapYZ[2][3] = 0.0;
  swapYZ[3][0] = 0.0;
  swapYZ[3][1] = 0.0;
  swapYZ[0][0] = 1.0;
  swapYZ[0][1] = 0.0;
  swapYZ[1][2] = 1.0;
  swapYZ[1][3] = 0.0;
  swapYZ[2][0] = 0.0;
  swapYZ[2][1] = 1.0;
  swapYZ[3][2] = 0.0;
  swapYZ[3][3] = 1.0;
  Transform::Transform(&t,swapYZ);
  Transform::operator*(&finalRenderFromLight,renderFromLight,&t);
  pGVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::GoniometricLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,pbrt::Image,pbrt::RGBColorSpace_const*&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,&finalRenderFromLight,medium,&I,&sc,&image,&imageColorSpace,
                      &alloc_local);
  std::__cxx11::string::~string((string *)&texname);
  Image::~Image(&image);
  return pGVar2;
}

Assistant:

GoniometricLight *GoniometricLight::Create(const Transform &renderFromLight,
                                           MediumHandle medium,
                                           const ParameterDictionary &parameters,
                                           const RGBColorSpace *colorSpace,
                                           const FileLoc *loc, Allocator alloc) {
    SpectrumHandle I = parameters.GetOneSpectrum("I", &colorSpace->illuminant,
                                                 SpectrumType::General, alloc);
    Float sc = parameters.GetOneFloat("scale", 1);

    Image image(alloc);
    const RGBColorSpace *imageColorSpace = nullptr;

    std::string texname = ResolveFilename(parameters.GetOneString("filename", ""));
    if (!texname.empty()) {
        ImageAndMetadata imageAndMetadata = Image::Read(texname, alloc);
        ImageChannelDesc rgbDesc = imageAndMetadata.image.GetChannelDesc({"R", "G", "B"});
        ImageChannelDesc yDesc = imageAndMetadata.image.GetChannelDesc({"Y"});

        imageColorSpace = imageAndMetadata.metadata.GetColorSpace();

        if (rgbDesc) {
            if (yDesc)
                ErrorExit("%s: has both \"R\", \"G\", and \"B\" or \"Y\" "
                          "channels.",
                          texname);
            image = Image(imageAndMetadata.image.Format(),
                          imageAndMetadata.image.Resolution(), {"Y"},
                          imageAndMetadata.image.Encoding(), alloc);
            for (int y = 0; y < image.Resolution().y; ++y)
                for (int x = 0; x < image.Resolution().x; ++x)
                    image.SetChannel(
                        {x, y}, 0,
                        imageAndMetadata.image.GetChannels({x, y}, rgbDesc).Average());
        } else if (yDesc)
            image = imageAndMetadata.image;
        else
            ErrorExit(loc,
                      "%s: has neither \"R\", \"G\", and \"B\" or \"Y\" "
                      "channels.",
                      texname);
    }

    sc /= SpectrumToPhotometric(I);

    Float phi_v = parameters.GetOneFloat("power", -1);
    if (phi_v > 0) {
        WrapMode2D wrapMode(WrapMode::Repeat, WrapMode::Clamp);
        // integrate over speherical coordinates [0,Pi], [0,2pi]
        Float sumY = 0;
        int width = image.Resolution().x, height = image.Resolution().y;
        for (int v = 0; v < height; ++v) {
            Float sinTheta = std::sin(Pi * Float(v + .5f) / Float(height));
            for (int u = 0; u < width; ++u)
                sumY += sinTheta * image.GetChannels({u, v}, wrapMode).Average();
        }
        Float k_e = 2 * Pi * Pi * sumY / (width * height);
        sc *= phi_v / k_e;
    }

    const Float swapYZ[4][4] = {1, 0, 0, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 0, 0, 1};
    Transform t(swapYZ);
    Transform finalRenderFromLight = renderFromLight * t;

    return alloc.new_object<GoniometricLight>(finalRenderFromLight, medium, I, sc,
                                              std::move(image), imageColorSpace, alloc);
}